

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

void __thiscall wabt::BinaryReaderLogging::WriteIndent(BinaryReaderLogging *this)

{
  ulong uVar1;
  
  for (uVar1 = (ulong)this->indent_; 0x8e < uVar1; uVar1 = uVar1 - 0x8e) {
    Stream::WriteData(this->stream_,WriteIndent::s_indent,0x8e,(char *)0x0,No);
  }
  if (uVar1 != 0) {
    Stream::WriteData(this->stream_,WriteIndent::s_indent,(long)this->indent_,(char *)0x0,No);
    return;
  }
  return;
}

Assistant:

void BinaryReaderLogging::WriteIndent() {
  static char s_indent[] =
      "                                                                       "
      "                                                                       ";
  static const size_t s_indent_len = sizeof(s_indent) - 1;
  size_t i = indent_;
  while (i > s_indent_len) {
    stream_->WriteData(s_indent, s_indent_len);
    i -= s_indent_len;
  }
  if (i > 0) {
    stream_->WriteData(s_indent, indent_);
  }
}